

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O2

_Bool react_to_specific_slay(slay_conflict *slay,monster_conflict *mon)

{
  _Bool _Var1;
  int iVar2;
  
  if ((slay->name != (char *)0x0) && (mon->race->base != (monster_base *)0x0)) {
    _Var1 = flag_has_dbg(mon->race->flags,0xc,slay->race_flag,"mon->race->flags","slay->race_flag");
    if (_Var1) {
      return true;
    }
    if ((slay->base != (char *)0x0) &&
       (iVar2 = strcmp(slay->base,mon->race->base->name), iVar2 == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool react_to_specific_slay(struct slay *slay, const struct monster *mon)
{
	if (!slay->name) return false;
	if (!mon->race->base) return false;

	/* Check the race flag */
	if (rf_has(mon->race->flags, slay->race_flag))
		return true;

	/* Check for monster base */
	if (slay->base && streq(slay->base, mon->race->base->name))
		return true;

	return false;
}